

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::SetupForHMI(HMISong *this,int len)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  TrackInfo *pTVar7;
  int local_30;
  int ii;
  int datastart;
  int tracklen;
  int start;
  int track_dir;
  int p;
  int i;
  int len_local;
  HMISong *this_local;
  
  this->ReadVarLen = ReadVarLenHMI;
  iVar2 = GetShort(this->MusHeader + 0xe4);
  this->NumTracks = iVar2;
  if (0 < this->NumTracks) {
    iVar2 = GetShort(this->MusHeader + 0xd4);
    (this->super_MIDIStreamer).Division = iVar2 << 2;
    (this->super_MIDIStreamer).InitialTempo = 4000000;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->NumTracks + 1);
    uVar6 = SUB168(auVar1 * ZEXT816(0x38),0);
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pTVar7 = (TrackInfo *)operator_new__(uVar6);
    this->Tracks = pTVar7;
    iVar2 = GetInt(this->MusHeader + 0xe8);
    start = 0;
    for (track_dir = 0; track_dir < this->NumTracks; track_dir = track_dir + 1) {
      iVar3 = GetInt(this->MusHeader + (long)(track_dir << 2) + (long)iVar2);
      if ((iVar3 <= len + -0x9d) &&
         (iVar4 = memcmp(this->MusHeader + iVar3,"HMI-MIDITRACK",0xd), iVar4 == 0)) {
        if (track_dir == this->NumTracks + -1) {
          ii = len - iVar3;
        }
        else {
          iVar4 = GetInt(this->MusHeader + (long)(track_dir << 2) + (long)iVar2 + 4);
          ii = iVar4 - iVar3;
        }
        iVar4 = MIN<int>(ii,len - iVar3);
        if (0 < iVar4) {
          iVar5 = GetInt(this->MusHeader + (long)iVar3 + 0x57);
          if (0 < iVar4 - iVar5) {
            this->Tracks[start].TrackBegin = this->MusHeader + (long)iVar5 + (long)iVar3;
            this->Tracks[start].TrackP = 0;
            this->Tracks[start].MaxTrackP = (long)(iVar4 - iVar5);
            for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
              iVar4 = GetShort(this->MusHeader + (long)(local_30 << 1) + (long)iVar3 + 0x99);
              this->Tracks[start].Designation[local_30] = (WORD)iVar4;
            }
            start = start + 1;
          }
        }
      }
    }
    this->NumTracks = start;
  }
  return;
}

Assistant:

void HMISong::SetupForHMI(int len)
{
	int i, p;

	ReadVarLen = ReadVarLenHMI;
	NumTracks = GetShort(MusHeader + HMI_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	// HMI files have two values here, a full value and a quarter value. Some games, 
	// notably Quarantines, have identical values for some reason, so it's safer to
	// use the quarter value and multiply it by four than to trust the full value.
	Division = GetShort(MusHeader + HMI_DIVISION_OFFSET) << 2;
	InitialTempo = 4000000;

	Tracks = new TrackInfo[NumTracks + 1];
	int track_dir = GetInt(MusHeader + HMI_TRACK_DIR_PTR_OFFSET);

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = GetInt(MusHeader + track_dir + i*4);
		int tracklen, datastart;

		if (start > len - HMITRACK_DESIGNATION_OFFSET - 4)
		{ // Track is incomplete.
			continue;
		}

		// BTW, HMI does not actually check the track header.
		if (memcmp(MusHeader + start, TRACK_MAGIC, 13) != 0)
		{
			continue;
		}

		// The track ends where the next one begins. If this is the
		// last track, then it ends at the end of the file.
		if (i == NumTracks - 1)
		{
			tracklen = len - start;
		}
		else
		{
			tracklen = GetInt(MusHeader + track_dir + i*4 + 4) - start;
		}
		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Offset to actual MIDI events.
		datastart = GetInt(MusHeader + start + HMITRACK_DATA_PTR_OFFSET);
		tracklen -= datastart;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + datastart;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
		for (int ii = 0; ii < NUM_HMI_DESIGNATIONS; ++ii)
		{
			Tracks[p].Designation[ii] = GetShort(MusHeader + start + HMITRACK_DESIGNATION_OFFSET + ii*2);
		}

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}